

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
          (QGraphicsSceneDragDropEvent *this,Type type)

{
  QGraphicsSceneDragDropEventPrivate *this_00;
  undefined4 in_ESI;
  QGraphicsSceneEventPrivate *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  this_00 = (QGraphicsSceneDragDropEventPrivate *)operator_new(0x70);
  QGraphicsSceneDragDropEventPrivate::QGraphicsSceneDragDropEventPrivate(this_00);
  QGraphicsSceneEvent::QGraphicsSceneEvent
            ((QGraphicsSceneEvent *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI,
             (Type)((ulong)this_00 >> 0x20));
  in_RDI->_vptr_QGraphicsSceneEventPrivate =
       (_func_int **)&PTR__QGraphicsSceneDragDropEvent_00d34b80;
  return;
}

Assistant:

QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent(Type type)
    : QGraphicsSceneEvent(*new QGraphicsSceneDragDropEventPrivate, type)
{
}